

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void generateCards(card *cards)

{
  card *this;
  pointer pcVar1;
  ostream *poVar2;
  type pcVar3;
  allocator local_e1;
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string local_68 [32];
  __cxx11 local_48 [32];
  uint local_28;
  uint i;
  unique_ptr<card,_std::default_delete<card>_> local_18;
  unique_ptr<card,_std::default_delete<card>_> temp;
  card *cards_local;
  
  temp._M_t.super___uniq_ptr_impl<card,_std::default_delete<card>_>._M_t.
  super__Tuple_impl<0UL,_card_*,_std::default_delete<card>_>.super__Head_base<0UL,_card_*,_false>.
  _M_head_impl = (__uniq_ptr_data<card,_std::default_delete<card>,_true,_true>)
                 (__uniq_ptr_data<card,_std::default_delete<card>,_true,_true>)cards;
  this = (card *)operator_new(0x30);
  card::card(this);
  std::unique_ptr<card,std::default_delete<card>>::unique_ptr<std::default_delete<card>,void>
            ((unique_ptr<card,std::default_delete<card>> *)&local_18,this);
  for (local_28 = 0; local_28 < 0xb; local_28 = local_28 + 1) {
    if (local_28 < 7) {
      pcVar1 = std::unique_ptr<card,_std::default_delete<card>_>::operator->(&local_18);
      card::setValue(pcVar1,local_28 + 1);
      pcVar1 = std::unique_ptr<card,_std::default_delete<card>_>::operator->(&local_18);
      std::__cxx11::to_string(local_48,local_28 + 1);
      card::setName(pcVar1,(string *)local_48);
      std::__cxx11::string::~string((string *)local_48);
    }
    else {
      pcVar1 = std::unique_ptr<card,_std::default_delete<card>_>::operator->(&local_18);
      card::setValue(pcVar1,1);
      switch(local_28) {
      case 7:
        pcVar1 = std::unique_ptr<card,_std::default_delete<card>_>::operator->(&local_18);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_68,"bolt",&local_69);
        card::setName(pcVar1,(string *)local_68);
        std::__cxx11::string::~string(local_68);
        std::allocator<char>::~allocator((allocator<char> *)&local_69);
        pcVar1 = std::unique_ptr<card,_std::default_delete<card>_>::operator->(&local_18);
        card::setCardType(pcVar1,1);
        break;
      case 8:
        pcVar1 = std::unique_ptr<card,_std::default_delete<card>_>::operator->(&local_18);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_90,"mirror",&local_91);
        card::setName(pcVar1,(string *)local_90);
        std::__cxx11::string::~string(local_90);
        std::allocator<char>::~allocator((allocator<char> *)&local_91);
        pcVar1 = std::unique_ptr<card,_std::default_delete<card>_>::operator->(&local_18);
        card::setCardType(pcVar1,2);
        break;
      case 9:
        pcVar1 = std::unique_ptr<card,_std::default_delete<card>_>::operator->(&local_18);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_b8,"blast",&local_b9);
        card::setName(pcVar1,(string *)local_b8);
        std::__cxx11::string::~string(local_b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_b9);
        pcVar1 = std::unique_ptr<card,_std::default_delete<card>_>::operator->(&local_18);
        card::setCardType(pcVar1,3);
        break;
      case 10:
        pcVar1 = std::unique_ptr<card,_std::default_delete<card>_>::operator->(&local_18);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_e0,"force",&local_e1);
        card::setName(pcVar1,(string *)local_e0);
        std::__cxx11::string::~string(local_e0);
        std::allocator<char>::~allocator((allocator<char> *)&local_e1);
        pcVar1 = std::unique_ptr<card,_std::default_delete<card>_>::operator->(&local_18);
        card::setCardType(pcVar1,4);
        break;
      default:
        poVar2 = std::operator<<((ostream *)&std::cout,"An error has occurred. ");
        std::operator<<(poVar2,"cards cannot be generated");
      }
    }
    pcVar3 = std::unique_ptr<card,_std::default_delete<card>_>::operator*(&local_18);
    card::operator=((card *)((long)temp._M_t.super___uniq_ptr_impl<card,_std::default_delete<card>_>
                                   ._M_t.super__Tuple_impl<0UL,_card_*,_std::default_delete<card>_>.
                                   super__Head_base<0UL,_card_*,_false>._M_head_impl +
                            (ulong)local_28 * 0x30),pcVar3);
  }
  std::unique_ptr<card,_std::default_delete<card>_>::~unique_ptr(&local_18);
  return;
}

Assistant:

void generateCards(card cards[]) {
    unique_ptr<card> temp(new card);
    for (unsigned int i = 0; i < CARD_TYPES; i++) {
        // numbered cards 1-7
        if (i < 7) {
            temp->setValue(i + 1);
            temp->setName(to_string(i + 1));
        }
        // special cards
        else {
            temp->setValue(1); // can be used to check if a card is numbered or special
            switch (i) {
                case 7:
                    temp->setName("bolt");
                    temp->setCardType(1);
                    break;
                case 8:
                    temp->setName("mirror");
                    temp->setCardType(2);
                    break;
                case 9:
                    temp->setName("blast");
                    temp->setCardType(3);
                    break;
                case 10:
                    temp->setName("force");
                    temp->setCardType(4);
                    break;
                default:
                    cout << "An error has occurred. " << "cards cannot be generated";
                    break;
            }
        }
        cards[i] = *temp;
    }
}